

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenRoomThreeAction.cpp
# Opt level: O0

ActionResults * __thiscall GreenRoomThreeAction::Look(GreenRoomThreeAction *this)

{
  itemType iVar1;
  ActionResults *this_00;
  allocator local_39;
  string local_38 [32];
  GreenRoomThreeAction *local_18;
  GreenRoomThreeAction *this_local;
  
  local_18 = this;
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == BASIN) {
    this_00 = (ActionResults *)operator_new(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,"The basin looks clean. You feel you can clean anything here.",&local_39);
    ActionResults::ActionResults(this_00,CURRENT,(string *)local_38);
    this_local = (GreenRoomThreeAction *)this_00;
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    this_local = (GreenRoomThreeAction *)AbstractRoomAction::Look(&this->super_AbstractRoomAction);
  }
  return (ActionResults *)this_local;
}

Assistant:

ActionResults * GreenRoomThreeAction::Look() {
    if(commands->getMainItem() == BASIN) {
        return new ActionResults(CURRENT, "The basin looks clean. You feel you can clean anything here.");
    } else {
        return AbstractRoomAction::Look();
    }

}